

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::
FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (optional<CPubKey> *__return_storage_ptr__,void *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = miniscript::IsTapscript(*this);
  if (bVar2) {
    if ((long)last._M_current - (long)first._M_current == 0x20) {
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      if (last._M_current != first._M_current) {
        xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)first._M_current;
        xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)(first._M_current + 8);
        xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)(first._M_current + 0x10);
        xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)(first._M_current + 0x18);
      }
      XOnlyPubKey::GetEvenCorrespondingCPubKey((CPubKey *)__return_storage_ptr__,&xonly_pubkey);
      (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
      super__Optional_payload_base<CPubKey>._M_engaged = true;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
      super__Optional_payload_base<CPubKey>._M_engaged = false;
    }
  }
  else {
    CPubKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((CPubKey *)&xonly_pubkey,first,last);
    if (((xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0] & 0xfe) == 2) ||
       ((bVar2 = false, xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0] < 8 &&
        ((0xd0U >> (xonly_pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0] & 0x1f) & 1) !=
         0)))) {
      memcpy(__return_storage_ptr__,&xonly_pubkey,0x41);
      bVar2 = true;
    }
    (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
    super__Optional_payload_base<CPubKey>._M_engaged = bVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKBytes(I first, I last) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            Key key{first, last};
            if (key.IsValid()) return key;
            return {};
        }
        if (last - first != 32) return {};
        XOnlyPubKey xonly_pubkey;
        std::copy(first, last, xonly_pubkey.begin());
        return xonly_pubkey.GetEvenCorrespondingCPubKey();
    }